

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_fourier_transform.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1d77a::InverseFastFourierTransformWrapper::~InverseFastFourierTransformWrapper
          (InverseFastFourierTransformWrapper *this)

{
  ~InverseFastFourierTransformWrapper(this);
  operator_delete(this);
  return;
}

Assistant:

~InverseFastFourierTransformWrapper() override {
  }